

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Product<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,3,false>,Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,_4,_1,_0,_4,_1> *dst,
               Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
               *src,assign_op<float,_float> *func)

{
  ActualDstType actualDst;
  assign_op<float,_float> *func_local;
  Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
  *src_local;
  Matrix<float,_4,_1,_0,_4,_1> *dst_local;
  
  Assignment<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>,_Eigen::internal::assign_op<float,_float>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}